

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool __thiscall ELFIO::elfio::layout_segments_and_their_sections(elfio *this)

{
  elfio *peVar1;
  segment *seg;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer ppsVar8;
  ulong uVar9;
  pointer ppsVar10;
  Elf_Xword seg_start_pos;
  Elf_Xword segment_filesize;
  Elf_Xword segment_memory;
  Elf_Xword local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> local_78;
  pointer local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  peVar1 = (this->sections).parent;
  local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.
                        super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (ulong)((uint)(*(int *)&(peVar1->sections_).
                                     super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(peVar1->sections_).
                                    super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff),
             (bool *)&local_78,(allocator_type *)&local_90);
  get_ordered_segments(&local_78,this);
  bVar3 = true;
  ppsVar8 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage;
  ppsVar10 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_88 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_80 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_60 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppsVar8 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppsVar10 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    do {
      seg = *ppsVar8;
      local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90 = (pointer)0x0;
      local_98 = this->current_file_pos;
      iVar4 = (*seg->_vptr_segment[3])(seg);
      if ((iVar4 == 6) && (iVar4 = (*seg->_vptr_segment[0x16])(seg), (short)iVar4 == 0)) {
        iVar4 = (*((this->header)._M_t.
                   super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                   .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->
                  _vptr_elf_header[0x1e])();
        local_98 = CONCAT44(extraout_var_00,iVar4);
        uVar5 = (*((this->header)._M_t.
                   super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                   .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->
                  _vptr_elf_header[9])();
        uVar6 = (*((this->header)._M_t.
                   super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                   .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->
                  _vptr_elf_header[0x1c])();
        local_90 = (pointer)((ulong)(uVar6 & 0xffff) * ((ulong)uVar5 & 0xffff));
        local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
        super__Vector_impl_data._M_start = local_90;
      }
      else {
        iVar4 = (*seg->_vptr_segment[0x18])(seg);
        if (((char)iVar4 == '\0') ||
           (iVar4 = (*seg->_vptr_segment[0x11])(seg), CONCAT44(extraout_var,iVar4) != 0)) {
          iVar4 = (*seg->_vptr_segment[0x16])(seg);
          if (((short)iVar4 == 0) ||
             (uVar5 = (*seg->_vptr_segment[0x17])(seg,0),
             (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[(uVar5 & 0xffff) >> 6] >>
              ((ulong)(uVar5 & 0xffff) & 0x3f) & 1) != 0)) {
            iVar4 = (*seg->_vptr_segment[0x16])(seg);
            if ((short)iVar4 != 0) {
              uVar5 = (*seg->_vptr_segment[0x17])(seg,0);
              local_98 = (**(code **)(*(long *)(((this->sections).parent)->sections_).
                                               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [uVar5 & 0xffff]._M_t.
                                               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                                     + 0xb8))();
            }
          }
          else {
            iVar4 = (*seg->_vptr_segment[7])(seg);
            if (CONCAT44(extraout_var_01,iVar4) == 0) {
              uVar9 = 1;
            }
            else {
              iVar4 = (*seg->_vptr_segment[7])(seg);
              uVar9 = CONCAT44(extraout_var_02,iVar4);
            }
            uVar2 = this->current_file_pos;
            iVar4 = (*seg->_vptr_segment[9])(seg);
            iVar7 = (*seg->_vptr_segment[7])(seg);
            local_98 = ((CONCAT44(extraout_var_03,iVar4) % uVar9 + CONCAT44(extraout_var_04,iVar7))
                       - uVar2 % uVar9) % uVar9 + this->current_file_pos;
            this->current_file_pos = local_98;
            ppsVar10 = local_60;
          }
        }
        else {
          local_98 = 0;
          iVar4 = (*seg->_vptr_segment[0x16])(seg);
          if ((short)iVar4 != 0) {
            local_90 = (pointer)this->current_file_pos;
            local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl
            .super__Vector_impl_data._M_start = local_90;
          }
        }
      }
      bVar3 = write_segment_data(this,seg,&local_58,(Elf_Xword *)&local_78,(Elf_Xword *)&local_90,
                                 &local_98);
      if (!bVar3) {
        bVar3 = false;
        ppsVar8 = local_88;
        ppsVar10 = local_80;
        goto LAB_00107eb8;
      }
      (*seg->_vptr_segment[0xe])(seg,&local_90);
      iVar4 = (*seg->_vptr_segment[0xf])(seg);
      if ((pointer)CONCAT44(extraout_var_05,iVar4) <
          local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        (*seg->_vptr_segment[0x10])(seg,&local_78);
      }
      (*seg->_vptr_segment[0x19])(seg);
      ppsVar8 = ppsVar8 + 1;
    } while (ppsVar8 != ppsVar10);
    bVar3 = true;
    ppsVar8 = local_88;
    ppsVar10 = local_80;
  }
LAB_00107eb8:
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (ppsVar10 != (pointer)0x0) {
    operator_delete(ppsVar10,(long)ppsVar8 - (long)ppsVar10);
  }
  return bVar3;
}

Assistant:

bool layout_segments_and_their_sections()
    {
        std::vector<segment*> worklist;
        std::vector<bool>     section_generated( sections.size(), false );

        // Get segments in a order in where segments which contain a
        // sub sequence of other segments are located at the end
        worklist = get_ordered_segments();

        for ( auto* seg : worklist ) {
            Elf_Xword segment_memory   = 0;
            Elf_Xword segment_filesize = 0;
            Elf_Xword seg_start_pos    = current_file_pos;
            // Special case: PHDR segment
            // This segment contains the program headers but no sections
            if ( seg->get_type() == PT_PHDR && seg->get_sections_num() == 0 ) {
                seg_start_pos  = header->get_segments_offset();
                segment_memory = segment_filesize =
                    header->get_segment_entry_size() *
                    static_cast<Elf_Xword>( header->get_segments_num() );
            }
            // Special case:
            else if ( seg->is_offset_initialized() && seg->get_offset() == 0 ) {
                seg_start_pos = 0;
                if ( seg->get_sections_num() > 0 ) {
                    segment_memory = segment_filesize = current_file_pos;
                }
            }
            // New segments with not generated sections
            // have to be aligned
            else if ( seg->get_sections_num() > 0 &&
                      !section_generated[seg->get_section_index_at( 0 )] ) {
                Elf_Xword align = seg->get_align() > 0 ? seg->get_align() : 1;
                Elf64_Off cur_page_alignment = current_file_pos % align;
                Elf64_Off req_page_alignment =
                    seg->get_virtual_address() % align;
                Elf64_Off adjustment = req_page_alignment - cur_page_alignment;

                current_file_pos += ( seg->get_align() + adjustment ) % align;
                seg_start_pos = current_file_pos;
            }
            else if ( seg->get_sections_num() > 0 ) {
                seg_start_pos =
                    sections[seg->get_section_index_at( 0 )]->get_offset();
            }

            // Write segment's data
            if ( !write_segment_data( seg, section_generated, segment_memory,
                                      segment_filesize, seg_start_pos ) ) {
                return false;
            }

            seg->set_file_size( segment_filesize );

            // If we already have a memory size from loading an elf file (value > 0),
            // it must not shrink!
            // Memory size may be bigger than file size and it is the loader's job to do something
            // with the surplus bytes in memory, like initializing them with a defined value.
            if ( seg->get_memory_size() < segment_memory ) {
                seg->set_memory_size( segment_memory );
            }

            seg->set_offset( seg_start_pos );
        }

        return true;
    }